

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  int iVar1;
  Expr *pExpr;
  sqlite3 *db;
  Op *pOVar2;
  ValueNewStat4Ctx *in_R9;
  sqlite3_value *pValue;
  sqlite3_value *local_30;
  
  if (pTab->pSelect == (Select *)0x0) {
    local_30 = (Mem *)0x0;
    pExpr = pTab->aCol[i].pDflt;
    if ((pExpr != (Expr *)0x0) &&
       (valueFromExpr(v->db,pExpr,v->db->enc,pTab->aCol[i].affinity,&local_30,in_R9),
       local_30 != (Mem *)0x0)) {
      db = v->db;
      if (db->mallocFailed == '\0') {
        pOVar2 = v->aOp;
        iVar1 = v->nOp;
        pOVar2[(long)iVar1 + -1].p4type = -7;
        pOVar2[(long)iVar1 + -1].p4.pMem = local_30;
      }
      else if (db->pnBytesFreed == (int *)0x0) {
        sqlite3ValueFree(local_30);
      }
      else {
        freeP4Mem(db,local_30);
      }
    }
  }
  if (pTab->aCol[i].affinity != 'E') {
    return;
  }
  sqlite3VdbeAddOp3(v,0x5c,iReg,0,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  assert( pTab!=0 );
  if( !pTab->pSelect ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    Column *pCol = &pTab->aCol[i];
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v), pCol->pDflt, enc, 
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}